

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_buffer.cpp
# Opt level: O3

packet * __thiscall libtorrent::aux::packet_buffer::at(packet_buffer *this,index_type idx)

{
  bool bVar1;
  
  if ((idx < this->m_capacity + this->m_first) &&
     (bVar1 = compare_less_wrap(idx,this->m_first,0xffff), !bVar1)) {
    return *(packet **)
            ((long)(this->m_storage).
                   super_unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
                   ._M_t.
                   super___uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
                   .
                   super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
            + (ulong)(this->m_capacity - 1 & idx) * 8);
  }
  return (packet *)0x0;
}

Assistant:

packet* packet_buffer::at(index_type idx) const
	{
		INVARIANT_CHECK;
		if (idx >= m_first + m_capacity)
			return nullptr;

		if (compare_less_wrap(idx, m_first, 0xffff))
			return nullptr;

		std::size_t const mask = m_capacity - 1;
		return m_storage[idx & mask].get();
	}